

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

size_t fileSize(file_t file)

{
  bool_t bVar1;
  size_t offset;
  ulong uVar2;
  size_t sVar3;
  
  offset = ftell((FILE *)file);
  sVar3 = 0xffffffffffffffff;
  if (offset != 0xffffffffffffffff) {
    bVar1 = fileSeek(file,0,2);
    if (bVar1 != 0) {
      uVar2 = ftell((FILE *)file);
      if (uVar2 != 0xffffffffffffffff) {
        bVar1 = fileSeek(file,offset,0);
        sVar3 = -(ulong)(bVar1 == 0) | uVar2;
      }
    }
  }
  return sVar3;
}

Assistant:

size_t fileSize(file_t file)
{
	size_t pos;
	size_t size;
	ASSERT(fileIsValid(file));
	if ((pos = fileTell(file)) == SIZE_MAX ||
		!fileSeek(file, 0, SEEK_END) ||
		(size = fileTell(file)) == SIZE_MAX ||
		!fileSeek(file, pos, SEEK_SET))
		return SIZE_MAX;
	return size;
}